

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

bool testing::Mock::VerifyAndClearExpectationsLocked(void *mock_obj)

{
  bool bVar1;
  size_type sVar2;
  iterator this;
  MutexBase *unaff_retaddr;
  key_type *in_stack_00000008;
  const_iterator it;
  FunctionMockers *mockers;
  bool expectations_met;
  UntypedFunctionMockerBase *in_stack_00000220;
  set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
  *in_stack_ffffffffffffffc8;
  _Self in_stack_ffffffffffffffd8;
  map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
  *in_stack_ffffffffffffffe0;
  bool local_1;
  
  internal::MutexBase::AssertHeld(unaff_retaddr);
  anon_unknown_18::MockObjectRegistry::states
            ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  sVar2 = std::
          map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
          ::count(in_stack_ffffffffffffffe0,(key_type *)in_stack_ffffffffffffffd8._M_node);
  if (sVar2 == 0) {
    local_1 = true;
  }
  else {
    local_1 = true;
    anon_unknown_18::MockObjectRegistry::states
              ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
    std::
    map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
    ::operator[]((map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
                  *)it._M_node,in_stack_00000008);
    std::
    set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
    ::begin(in_stack_ffffffffffffffc8);
    while( true ) {
      this = std::
             set<testing::internal::UntypedFunctionMockerBase_*,_std::less<testing::internal::UntypedFunctionMockerBase_*>,_std::allocator<testing::internal::UntypedFunctionMockerBase_*>_>
             ::end(in_stack_ffffffffffffffc8);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd8,(_Self *)&stack0xffffffffffffffd0);
      if (!bVar1) break;
      std::_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*>::operator*
                ((_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*> *)
                 this._M_node);
      bVar1 = internal::UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
                        (in_stack_00000220);
      if (!bVar1) {
        local_1 = false;
      }
      std::_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*>::operator++
                ((_Rb_tree_const_iterator<testing::internal::UntypedFunctionMockerBase_*> *)
                 this._M_node);
    }
  }
  return local_1;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(internal::g_gmock_mutex) {
  internal::g_gmock_mutex.AssertHeld();
  if (g_mock_object_registry.states().count(mock_obj) == 0) {
    // No EXPECT_CALL() was set on the given mock object.
    return true;
  }

  // Verifies and clears the expectations on each mock method in the
  // given mock object.
  bool expectations_met = true;
  FunctionMockers& mockers =
      g_mock_object_registry.states()[mock_obj].function_mockers;
  for (FunctionMockers::const_iterator it = mockers.begin();
       it != mockers.end(); ++it) {
    if (!(*it)->VerifyAndClearExpectationsLocked()) {
      expectations_met = false;
    }
  }

  // We don't clear the content of mockers, as they may still be
  // needed by ClearDefaultActionsLocked().
  return expectations_met;
}